

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkinformation.cpp
# Opt level: O1

bool QNetworkInformation::loadBackendByName(QStringView backend)

{
  char cVar1;
  int iVar2;
  QNetworkInformation *pQVar3;
  storage_type_conflict *in_RDX;
  long in_FS_OFFSET;
  bool bVar4;
  QStringView QVar5;
  QStringView QVar6;
  QStringView name;
  QArrayData *local_40;
  storage_type_conflict *local_38;
  qsizetype local_30;
  long local_28;
  storage_type_conflict *extraout_RDX;
  
  name.m_size = backend.m_data;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((QNetworkInformationPrivate *)backend.m_size == (QNetworkInformationPrivate *)0x5) &&
     (QVar5.m_data = L"dummy", QVar5.m_size = 5, cVar1 = QtPrivate::equalStrings(backend,QVar5),
     in_RDX = extraout_RDX, cVar1 != '\0')) {
    pQVar3 = QNetworkInformationPrivate::createDummy();
    bVar4 = pQVar3 != (QNetworkInformation *)0x0;
  }
  else {
    name.m_data = in_RDX;
    pQVar3 = QNetworkInformationPrivate::create((QNetworkInformationPrivate *)backend.m_size,name);
    if (pQVar3 == (QNetworkInformation *)0x0) {
      bVar4 = false;
    }
    else {
      (**(code **)(**(long **)(*(long *)&pQVar3->field_0x8 + 0x78) + 0x60))(&local_40);
      QVar6.m_data = local_38;
      QVar6.m_size = local_30;
      iVar2 = QtPrivate::compareStrings(backend,QVar6,CaseInsensitive);
      bVar4 = iVar2 == 0;
      if (local_40 != (QArrayData *)0x0) {
        LOCK();
        (local_40->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_40->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_40->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_40,2,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar4;
}

Assistant:

bool QNetworkInformation::loadBackendByName(QStringView backend)
{
    if (backend == u"dummy")
        return QNetworkInformationPrivate::createDummy() != nullptr;

    auto loadedBackend = QNetworkInformationPrivate::create(backend);
    return loadedBackend && loadedBackend->backendName().compare(backend, Qt::CaseInsensitive) == 0;
}